

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnDie
          (RenX_LoggingPlugin *this,Server *server,string_view object,TeamType *objectTeam,
          string_view damageType)

{
  bool bVar1;
  __sv_type _Var2;
  undefined1 auVar3 [16];
  code *local_1c0;
  size_t local_148;
  char *local_140;
  size_t local_118;
  char *local_110;
  size_t local_f8;
  char *local_f0;
  size_t local_d8;
  char *local_d0;
  size_t local_b8;
  char *local_b0;
  size_t local_80;
  char *local_78;
  undefined1 local_60 [8];
  string msg;
  logFuncType func;
  TeamType *objectTeam_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view object_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x1a & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_60,&this->dieFmt2);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  if (!bVar1) {
    RenX::processTags((string *)local_60,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x208))
    ;
    auVar3 = RenX::translateName(object._M_len,object._M_str);
    local_80 = _Var2._M_len;
    local_78 = _Var2._M_str;
    RenX::replace_tag(local_60,local_80,local_78,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x3a8))
    ;
    auVar3 = RenX::getTeamColor(*objectTeam);
    local_b8 = _Var2._M_len;
    local_b0 = _Var2._M_str;
    RenX::replace_tag(local_60,local_b8,local_b0,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 0x3c8))
    ;
    auVar3 = RenX::getTeamName(*objectTeam);
    local_d8 = _Var2._M_len;
    local_d0 = _Var2._M_str;
    RenX::replace_tag(local_60,local_d8,local_d0,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(RenX::tags + 1000));
    auVar3 = RenX::getFullTeamName(*objectTeam);
    local_f8 = _Var2._M_len;
    local_f0 = _Var2._M_str;
    RenX::replace_tag(local_60,local_f8,local_f0,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x14c8));
    auVar3 = RenX::translateName(damageType._M_len,damageType._M_str);
    local_118 = _Var2._M_len;
    local_110 = _Var2._M_str;
    RenX::replace_tag(local_60,local_118,local_110,auVar3._0_8_,auVar3._8_8_);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_1c0 = (code *)msg.field_2._8_8_;
    }
    else {
      local_1c0 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_148 = _Var2._M_len;
    local_140 = _Var2._M_str;
    (*local_1c0)(server,local_148,local_140);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnDie(RenX::Server &server, std::string_view object, const RenX::TeamType &objectTeam, std::string_view damageType)
{
	logFuncType func;
	if (RenX_LoggingPlugin::diePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->dieFmt2;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_NAME_TAG, RenX::translateName(object));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(objectTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(objectTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(objectTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WEAPON_TAG, RenX::translateName(damageType));
		(server.*func)(msg);
	}
}